

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  ARKodeARKStepMem step_mem;
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  N_Vector p_Var3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  sunrealtype sVar13;
  long lStack_40;
  int local_34;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xbe6,"arkStep_StageSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  uVar9 = step_mem->istage;
  lVar11 = (long)(int)uVar9;
  psVar1 = step_mem->cvals;
  pp_Var2 = step_mem->Xvecs;
  if (implicit == 0) {
    local_34 = 0;
    iVar8 = 0;
  }
  else {
    dVar12 = ark_mem->h * step_mem->Bi->A[lVar11][lVar11];
    step_mem->gamma = dVar12;
    if (ark_mem->firststage == 0) {
      sVar13 = dVar12 / step_mem->gammap;
    }
    else {
      step_mem->gammap = dVar12;
      sVar13 = 1.0;
    }
    step_mem->gamrat = sVar13;
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->yn,step_mem->zpred,step_mem->sdata);
    *psVar1 = 1.0;
    p_Var3 = step_mem->sdata;
    *pp_Var2 = p_Var3;
    local_34 = 1;
    iVar8 = 1;
    if (step_mem->mass_type == 1) {
      N_VScale(0x3ff0000000000000,p_Var3,ark_mem->tempv1);
      iVar6 = (*step_mem->mmult)(ark_mem,ark_mem->tempv1,step_mem->sdata);
      if (iVar6 != 0) {
        return -0x12;
      }
    }
  }
  if (step_mem->explicit != 0) {
    uVar7 = 0;
    uVar10 = 0;
    if (0 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      *(double *)((long)psVar1 + uVar7 * 8 + (ulong)(uint)(iVar8 << 3)) =
           ark_mem->h * step_mem->Be->A[lVar11][uVar7];
      *(N_Vector *)((long)pp_Var2 + uVar7 * 8 + (ulong)(uint)(iVar8 << 3)) = step_mem->Fe[uVar7];
    }
    iVar8 = iVar8 + (int)uVar7;
    local_34 = iVar8;
  }
  if (step_mem->implicit != 0) {
    uVar7 = 0;
    uVar10 = 0;
    if (0 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      psVar1[(long)iVar8 + uVar7] = ark_mem->h * step_mem->Bi->A[lVar11][uVar7];
      pp_Var2[(long)iVar8 + uVar7] = step_mem->Fi[uVar7];
    }
    iVar8 = iVar8 + (int)uVar7;
    local_34 = iVar8;
  }
  if (step_mem->expforcing == 0) {
    if (step_mem->impforcing == 0) goto LAB_001264a9;
    lStack_40 = 0x78;
  }
  else {
    lStack_40 = 0x70;
  }
  uVar9 = uVar9 + (step_mem->expforcing == 0);
  lVar4 = *(long *)((long)&step_mem->fe + lStack_40);
  lVar5 = *(long *)(lVar4 + 0x10);
  lVar4 = *(long *)(lVar4 + 0x18);
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)uVar9;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    step_mem->stage_times[uVar7] = *(double *)(lVar4 + uVar7 * 8) * ark_mem->h + ark_mem->tn;
    step_mem->stage_coefs[uVar7] =
         ark_mem->h * *(double *)(*(long *)(lVar5 + lVar11 * 8) + uVar7 * 8);
  }
  arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,uVar9,&local_34);
  iVar8 = local_34;
LAB_001264a9:
  iVar6 = N_VLinearCombination(iVar8,psVar1,pp_Var2,step_mem->sdata);
  iVar8 = -0x1c;
  if (iVar6 == 0) {
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, sunbooleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, jmax, nvec;
  sunrealtype* cj;
  sunrealtype** Aij;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit)
  {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
    step_mem->gamrat = (ark_mem->firststage)
                         ? ONE
                         : step_mem->gamma /
                             step_mem->gammap; /* protect x/x != 1.0 */
  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit)
  {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec     = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED))
  {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void*)ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit)
  { /* Explicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit)
  { /* Implicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial (MRI) forcing (M = I required) */
  if (step_mem->expforcing || step_mem->impforcing)
  {
    if (step_mem->expforcing)
    {
      jmax = i;
      Aij  = step_mem->Be->A;
      cj   = step_mem->Be->c;
    }
    else
    {
      jmax = i + 1;
      Aij  = step_mem->Bi->A;
      cj   = step_mem->Bi->c;
    }

    for (j = 0; j < jmax; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * Aij[i][j];
    }

    arkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         jmax, &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}